

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty_test_pe.cc
# Opt level: O0

void Normalize(string *contents)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  ulong uVar4;
  string *in_RDI;
  size_type end;
  string tmp;
  stringstream buffer;
  string local_1e8 [32];
  long local_1c8;
  string local_1b0 [32];
  stringstream local_190 [392];
  string *local_8;
  
  local_8 = in_RDI;
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_190,in_RDI,_Var2);
  std::__cxx11::string::clear();
  std::__cxx11::string::string(local_1b0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_190,local_1b0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    local_1c8 = std::__cxx11::string::find_last_not_of((char *)local_1b0,0x5b8010);
    if (local_1c8 == -1) {
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::substr((ulong)local_1e8,(ulong)local_1b0);
      std::__cxx11::string::operator=(local_1b0,local_1e8);
      std::__cxx11::string::~string(local_1e8);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=(local_8,"\n");
    }
    std::__cxx11::string::operator+=(local_8,local_1b0);
  }
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void Normalize(std::string& contents) {
  std::stringstream buffer(contents);
  contents.clear();
  std::string tmp;
  while (std::getline(buffer, tmp)) {
    auto end = tmp.find_last_not_of("\t \r");
    if (end != std::string::npos) {
      tmp = tmp.substr(0, end + 1);
    }
    else {
      tmp.clear();
    }
    if (!contents.empty()) {
      contents += "\n";
    }
    contents += tmp;
  }
}